

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<VkSpecParser::TypedName>::reallocateAndGrow
          (QArrayDataPointer<VkSpecParser::TypedName> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<VkSpecParser::TypedName> *old)

{
  bool bVar1;
  QGenericArrayOps<VkSpecParser::TypedName> *this_00;
  TypedName *b;
  long in_RCX;
  long in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<VkSpecParser::TypedName> *unaff_retaddr;
  qsizetype toCopy;
  QArrayDataPointer<VkSpecParser::TypedName> dp;
  QArrayDataPointer<VkSpecParser::TypedName> *in_stack_ffffffffffffff88;
  TypedName *in_stack_ffffffffffffff90;
  TypedName *in_stack_ffffffffffffff98;
  QGenericArrayOps<VkSpecParser::TypedName> *in_stack_ffffffffffffffa0;
  Data *local_20;
  TypedName *local_18;
  qsizetype n_00;
  
  n_00 = *(qsizetype *)(in_FS_OFFSET + 0x28);
  local_20 = (Data *)0xaaaaaaaaaaaaaaaa;
  local_18 = (TypedName *)0xaaaaaaaaaaaaaaaa;
  allocateGrow(unaff_retaddr,n_00,0xaaaaaaaa);
  if (0 < in_RDX) {
    qt_noop();
  }
  if (*(long *)(in_RDI + 0x10) != 0) {
    bVar1 = needsDetach((QArrayDataPointer<VkSpecParser::TypedName> *)in_stack_ffffffffffffff90);
    if ((bVar1) || (in_RCX != 0)) {
      this_00 = (QGenericArrayOps<VkSpecParser::TypedName> *)
                operator->((QArrayDataPointer<VkSpecParser::TypedName> *)&local_20);
      begin((QArrayDataPointer<VkSpecParser::TypedName> *)0x114cb6);
      begin((QArrayDataPointer<VkSpecParser::TypedName> *)0x114cc5);
      QtPrivate::QGenericArrayOps<VkSpecParser::TypedName>::copyAppend
                (this_00,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
    }
    else {
      in_stack_ffffffffffffff90 =
           (TypedName *)operator->((QArrayDataPointer<VkSpecParser::TypedName> *)&local_20);
      b = begin((QArrayDataPointer<VkSpecParser::TypedName> *)0x114cfb);
      begin((QArrayDataPointer<VkSpecParser::TypedName> *)0x114d0a);
      QtPrivate::QGenericArrayOps<VkSpecParser::TypedName>::moveAppend
                (in_stack_ffffffffffffffa0,b,in_stack_ffffffffffffff90);
    }
  }
  swap((QArrayDataPointer<VkSpecParser::TypedName> *)in_stack_ffffffffffffff90,
       in_stack_ffffffffffffff88);
  if (in_RCX != 0) {
    swap((QArrayDataPointer<VkSpecParser::TypedName> *)in_stack_ffffffffffffff90,
         in_stack_ffffffffffffff88);
  }
  ~QArrayDataPointer((QArrayDataPointer<VkSpecParser::TypedName> *)in_stack_ffffffffffffff90);
  if (*(long *)(in_FS_OFFSET + 0x28) == n_00) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }